

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Channel::Channel(Channel *this)

{
  Channel *local_18;
  Channel *this_local;
  
  local_18 = this;
  do {
    Operator::Operator(local_18->op);
    local_18 = (Channel *)(local_18->op + 1);
  } while (local_18 != (Channel *)&this->synthHandler);
  this->old[1] = 0;
  this->old[0] = 0;
  this->chanData = 0;
  this->regB0 = '\0';
  this->regC0 = '\0';
  this->maskLeft = -1;
  this->maskRight = -1;
  this->feedback = '\x1f';
  this->fourMask = '\0';
  this->synthHandler = (SynthHandler)BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)1>;
  *(undefined8 *)&this->field_0xd8 = 0;
  return;
}

Assistant:

Channel::Channel() {
	old[0] = old[1] = 0;
	chanData = 0;
	regB0 = 0;
	regC0 = 0;
	maskLeft = -1;
	maskRight = -1;
	feedback = 31;
	fourMask = 0;
	synthHandler = &Channel::BlockTemplate< sm2FM >;
}